

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O1

void __thiscall Prog::process_key_char(Prog *this,int unichar)

{
  pointer ppSVar1;
  int iVar2;
  uint uVar3;
  SampleInstance *this_00;
  
  iVar2 = toupper(unichar);
  if (iVar2 < 0x53) {
    if (iVar2 == 0x20) {
      if (this->cur_element == (Element *)0x0) {
        return;
      }
      (*this->cur_element->_vptr_Element[3])();
      return;
    }
    if (iVar2 == 0x41) {
      new_audiostream(this);
      return;
    }
    if (iVar2 == 0x4d) {
      new_mixer(this);
      return;
    }
  }
  else {
    if (iVar2 == 0x53) {
      new_sample_instance(this);
      return;
    }
    if (iVar2 == 0x58) {
      if (this->cur_element == (Element *)0x0) {
        return;
      }
      delete_element(this,this->cur_element);
      this->cur_element = (Element *)0x0;
      return;
    }
    if (iVar2 == 0x56) {
      new_voice(this);
      return;
    }
  }
  uVar3 = iVar2 - 0x31;
  if (uVar3 < 9) {
    ppSVar1 = (this->samples).super__Vector_base<const_Sample_*,_std::allocator<const_Sample_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)uVar3 <
        (ulong)((long)(this->samples).
                      super__Vector_base<const_Sample_*,_std::allocator<const_Sample_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3)) {
      if (this->cur_element == (Element *)0x0) {
        this_00 = (SampleInstance *)0x0;
      }
      else {
        this_00 = (SampleInstance *)
                  __dynamic_cast(this->cur_element,&Element::typeinfo,&SampleInstance::typeinfo,0);
      }
      if (this_00 != (SampleInstance *)0x0) {
        SampleInstance::set_sample(this_00,ppSVar1[uVar3]);
        return;
      }
    }
  }
  return;
}

Assistant:

void Prog::process_key_char(int unichar)
{
   int upper = toupper(unichar);
   if (upper == 'V') {
      new_voice();
   }
   else if (upper == 'M') {
      new_mixer();
   }
   else if (upper == 'S') {
      new_sample_instance();
   }
   else if (upper == 'A') {
      new_audiostream();
   }
   else if (upper == ' ') {
      if (cur_element) {
         cur_element->toggle_playing();
      }
   }
   else if (upper == 'X') {
      if (cur_element) {
         delete_element(cur_element);
         cur_element = NULL;
      }
   }
   else if (upper >= '1' && upper <= '9') {
      unsigned n = upper - '1';
      SampleInstance *splinst;
      if (n < samples.size() &&
         (splinst = dynamic_cast<SampleInstance *>(cur_element)))
      {
         splinst->set_sample(*samples.at(n));
      }
   }
}